

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.h
# Opt level: O2

void __thiscall
rest_rpc::rpc_service::connection::response_interal
          (connection *this,uint64_t req_id,
          shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *data,request_type req_type)

{
  size_type sVar1;
  undefined7 in_register_00000009;
  void *__buf;
  int __fd;
  message_type local_38;
  
  __fd = (int)&local_38;
  local_38.content.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (data->
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr;
  local_38.content.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (data->
       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
       )._M_refcount._M_pi;
  (data->
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  )._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (data->
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  )._M_ptr = (element_type *)0x0;
  local_38.req_id = req_id;
  local_38.req_type = req_type;
  std::deque<rest_rpc::message_type,_std::allocator<rest_rpc::message_type>_>::
  emplace_back<rest_rpc::message_type>(&this->write_queue_,&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.content.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  sVar1 = std::deque<rest_rpc::message_type,_std::allocator<rest_rpc::message_type>_>::size
                    (&this->write_queue_);
  if (sVar1 < 2) {
    write(this,__fd,__buf,CONCAT71(in_register_00000009,req_type));
  }
  return;
}

Assistant:

void response_interal(uint64_t req_id, std::shared_ptr<std::string> data,
                        request_type req_type = request_type::req_res) {
    assert(data->size() < MAX_BUF_LEN);

    write_queue_.emplace_back(message_type{req_id, req_type, std::move(data)});
    if (write_queue_.size() > 1) {
      return;
    }

    write();
  }